

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef BinaryenThrowGetOperandAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  if (expr->_id != ThrowId) {
    __assert_fail("expression->is<Throw>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xf03,
                  "BinaryenExpressionRef BinaryenThrowGetOperandAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  if ((ulong)index < expr[2].type.id) {
    return *(BinaryenExpressionRef *)(*(long *)(expr + 2) + (ulong)index * 8);
  }
  __assert_fail("index < static_cast<Throw*>(expression)->operands.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xf04,
                "BinaryenExpressionRef BinaryenThrowGetOperandAt(BinaryenExpressionRef, BinaryenIndex)"
               );
}

Assistant:

BinaryenExpressionRef BinaryenThrowGetOperandAt(BinaryenExpressionRef expr,
                                                BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Throw>());
  assert(index < static_cast<Throw*>(expression)->operands.size());
  return static_cast<Throw*>(expression)->operands[index];
}